

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalQuantity::readDecNumberToBcd(DecimalQuantity *this,DecNum *decnum)

{
  decNumber *pdVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  int8_t *piVar5;
  
  pdVar1 = (decnum->fData).ptr;
  iVar2 = pdVar1->digits;
  if ((long)iVar2 < 0x11) {
    if (iVar2 < 1) {
      piVar5 = (int8_t *)0x0;
    }
    else {
      puVar3 = pdVar1->lsu;
      lVar4 = 0;
      piVar5 = (int8_t *)0x0;
      do {
        piVar5 = (int8_t *)((ulong)piVar5 | (ulong)*puVar3 << ((byte)lVar4 & 0x3f));
        puVar3 = puVar3 + 1;
        lVar4 = lVar4 + 4;
      } while ((long)iVar2 * 4 != lVar4);
    }
    (this->fBCD).bcdBytes.ptr = piVar5;
    iVar2 = pdVar1->digits;
  }
  else {
    ensureCapacity(this,iVar2);
    iVar2 = pdVar1->digits;
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        (this->fBCD).bcdBytes.ptr[lVar4] = pdVar1->lsu[lVar4];
        lVar4 = lVar4 + 1;
        iVar2 = pdVar1->digits;
      } while (lVar4 < iVar2);
    }
  }
  this->scale = pdVar1->exponent;
  this->precision = iVar2;
  return;
}

Assistant:

void DecimalQuantity::readDecNumberToBcd(const DecNum& decnum) {
    const decNumber* dn = decnum.getRawDecNumber();
    if (dn->digits > 16) {
        ensureCapacity(dn->digits);
        for (int32_t i = 0; i < dn->digits; i++) {
            fBCD.bcdBytes.ptr[i] = dn->lsu[i];
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < dn->digits; i++) {
            result |= static_cast<uint64_t>(dn->lsu[i]) << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = dn->exponent;
    precision = dn->digits;
}